

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

IStreamingReporter * __thiscall
Catch::LegacyReporterRegistrar<Catch::XmlReporter>::ReporterFactory::create
          (ReporterFactory *this,ReporterConfig *config)

{
  IStreamingReporter *pIVar1;
  XmlReporter *this_00;
  
  pIVar1 = (IStreamingReporter *)operator_new(0x18);
  this_00 = (XmlReporter *)operator_new(0x78);
  XmlReporter::XmlReporter(this_00,config);
  (**(code **)((long)(this_00->super_SharedImpl<Catch::IReporter>).super_IReporter.super_IShared.
                     super_NonCopyable + 0x10))(this_00);
  *(undefined4 *)&pIVar1[1].super_IShared.super_NonCopyable._vptr_NonCopyable = 0;
  (pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__LegacyReporterAdapter_00174ab0;
  pIVar1[2].super_IShared.super_NonCopyable._vptr_NonCopyable = (_func_int **)this_00;
  (**(code **)((long)(this_00->super_SharedImpl<Catch::IReporter>).super_IReporter.super_IShared.
                     super_NonCopyable + 0x10))(this_00);
  (**(code **)((long)(this_00->super_SharedImpl<Catch::IReporter>).super_IReporter.super_IShared.
                     super_NonCopyable + 0x18))(this_00);
  return pIVar1;
}

Assistant:

virtual IStreamingReporter* create( ReporterConfig const& config ) const {
                return new LegacyReporterAdapter( new T( config ) );
            }